

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestProgress::testVertBar(TestProgress *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Orientation OVar4;
  int iVar5;
  ProgressBar p;
  QWidget w;
  QVBoxLayout l;
  QSignalSpy spy;
  
  QWidget::QWidget(&w,0,0);
  QVBoxLayout::QVBoxLayout(&l);
  QWidget::setLayout((QLayout *)&w);
  QtMWidgets::ProgressBar::ProgressBar(&p,(QWidget *)0x0);
  QBoxLayout::addWidget(&l,&p,0,0);
  QWidget::show();
  bVar1 = (bool)QTest::qWaitForWindowActive(&w,5000);
  cVar2 = QTest::qVerify(bVar1,"QTest::qWaitForWindowActive( &w )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                         ,0x54);
  if (cVar2 != '\0') {
    QSignalSpy::QSignalSpy<void(QtMWidgets::ProgressBar::*)(int)>(&spy,&p,0x164c92);
    QtMWidgets::ProgressBar::setMinimum(&p,0);
    QtMWidgets::ProgressBar::setMaximum(&p,100);
    QtMWidgets::ProgressBar::setValue(&p,1);
    QtMWidgets::ProgressBar::setOrientation(&p,Vertical);
    QWidget::resize(&w,0x32,0x96);
    iVar3 = QtMWidgets::ProgressBar::minimum(&p);
    cVar2 = QTest::qVerify(iVar3 == 0,"p.minimum() == 0","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                           ,0x5f);
    if (cVar2 != '\0') {
      iVar3 = QtMWidgets::ProgressBar::maximum(&p);
      cVar2 = QTest::qVerify(iVar3 == 100,"p.maximum() == 100","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                             ,0x60);
      if (cVar2 != '\0') {
        iVar3 = QtMWidgets::ProgressBar::value(&p);
        cVar2 = QTest::qVerify(iVar3 == 1,"p.value() == 1","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                               ,0x61);
        if (cVar2 != '\0') {
          OVar4 = QtMWidgets::ProgressBar::orientation(&p);
          cVar2 = QTest::qVerify(OVar4 == Vertical,"p.orientation() == Qt::Vertical","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                 ,0x62);
          if (cVar2 != '\0') {
            bVar1 = QtMWidgets::ProgressBar::invertedAppearance(&p);
            cVar2 = QTest::qVerify(!bVar1,"p.invertedAppearance() == false","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                   ,99);
            if (cVar2 != '\0') {
              cVar2 = QTest::qVerify(spy.super_QList<QList<QVariant>_>.d.size == 1,
                                     "spy.count() == 1","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                     ,100);
              if (cVar2 != '\0') {
                iVar3 = QtMWidgets::ProgressBar::minimum(&p);
                while( true ) {
                  iVar5 = QtMWidgets::ProgressBar::maximum(&p);
                  if (iVar5 < iVar3) break;
                  QtMWidgets::ProgressBar::setValue(&p,iVar3);
                  iVar5 = QtMWidgets::ProgressBar::value(&p);
                  cVar2 = QTest::qVerify(iVar3 == iVar5,"p.value() == i","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                         ,0x69);
                  if (cVar2 == '\0') goto LAB_00160861;
                  QTest::qWait(0x32);
                  iVar3 = iVar3 + 10;
                }
                QtMWidgets::ProgressBar::reset(&p);
                QTest::qWait(0x226);
                QtMWidgets::ProgressBar::setInvertedAppearance(&p,true);
                bVar1 = QtMWidgets::ProgressBar::invertedAppearance(&p);
                cVar2 = QTest::qVerify(bVar1,"p.invertedAppearance() == true","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                       ,0x72);
                if (cVar2 != '\0') {
                  iVar3 = QtMWidgets::ProgressBar::minimum(&p);
                  while( true ) {
                    iVar5 = QtMWidgets::ProgressBar::maximum(&p);
                    if (iVar5 < iVar3) break;
                    QtMWidgets::ProgressBar::setValue(&p,iVar3);
                    iVar5 = QtMWidgets::ProgressBar::value(&p);
                    cVar2 = QTest::qVerify(iVar3 == iVar5,"p.value() == i","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                           ,0x77);
                    if (cVar2 == '\0') break;
                    QTest::qWait(0x32);
                    iVar3 = iVar3 + 10;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00160861:
    QSignalSpy::~QSignalSpy(&spy);
  }
  QtMWidgets::ProgressBar::~ProgressBar(&p);
  QVBoxLayout::~QVBoxLayout(&l);
  QWidget::~QWidget(&w);
  return;
}

Assistant:

void testVertBar()
	{
		QWidget w;
		QVBoxLayout l;
		w.setLayout( &l );
		QtMWidgets::ProgressBar p;
		l.addWidget( &p );

		w.show();

		QVERIFY( QTest::qWaitForWindowActive( &w ) );

		QSignalSpy spy( &p, &QtMWidgets::ProgressBar::valueChanged );

		p.setMinimum( 0 );
		p.setMaximum( 100 );
		p.setValue( 1 );
		p.setOrientation( Qt::Vertical );

		w.resize( 50, 150 );

		QVERIFY( p.minimum() == 0 );
		QVERIFY( p.maximum() == 100 );
		QVERIFY( p.value() == 1 );
		QVERIFY( p.orientation() == Qt::Vertical );
		QVERIFY( p.invertedAppearance() == false );
		QVERIFY( spy.count() == 1 );

		for( int i = p.minimum(); i <= p.maximum(); i += 10 )
		{
			p.setValue( i );
			QVERIFY( p.value() == i );
			QTest::qWait( 50 );
		}

		p.reset();
		QTest::qWait( 550 );

		p.setInvertedAppearance( true );

		QVERIFY( p.invertedAppearance() == true );

		for( int i = p.minimum(); i <= p.maximum(); i += 10 )
		{
			p.setValue( i );
			QVERIFY( p.value() == i );
			QTest::qWait( 50 );
		}
	}